

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  int iVar4;
  int iVar5;
  NodeType NVar6;
  Bool BVar7;
  int iVar8;
  Node *node;
  Node *pNVar9;
  Node **ppNVar10;
  int iVar11;
  int iVar12;
  
  pLVar2 = doc->lexer;
  iVar12 = 0;
  iVar11 = 0;
LAB_00141f47:
  while( true ) {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      return;
    }
    pDVar3 = node->tag;
    if (pDVar3 == head->tag) break;
    if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_HTML)) {
      NVar6 = node->type;
      goto LAB_00141f86;
    }
LAB_00141fad:
    BVar7 = prvTidynodeIsText(node);
    if (BVar7 != no) {
      if ((*(int *)((doc->config).value + 0x3b) != 0) || (*(int *)((doc->config).value + 6) == 1))
      goto LAB_00142102;
      goto LAB_001420ed;
    }
    if ((node->type != ProcInsTag) ||
       ((node->element == (ctmbstr)0x0 ||
        (iVar8 = prvTidytmbstrcmp(node->element,"xml-stylesheet"), iVar8 != 0)))) goto LAB_00141fdf;
    prvTidyReport(doc,head,node,0x27e);
    pNVar9 = prvTidyFindHTML(doc);
    prvTidyInsertNodeBeforeElement(pNVar9,node);
  }
  NVar6 = node->type;
  if (NVar6 == EndTag) {
    prvTidyFreeNode(doc,node);
    head->closed = yes;
    return;
  }
LAB_00141f86:
  if (NVar6 != StartTag) goto LAB_00141fad;
  goto LAB_00141f8b;
LAB_00141fdf:
  BVar7 = InsertMisc(head,node);
  if (BVar7 != no) goto LAB_00141f47;
  if (node->type == DocTypeTag) {
    InsertDocType(doc,head,node);
    goto LAB_00141f47;
  }
  if (node->tag != (Dict *)0x0) {
    if ((node->tag->model & 4) == 0) {
      if (pLVar2->isvoyager != no) {
LAB_001420ed:
        prvTidyReport(doc,head,node,0x27e);
      }
LAB_00142102:
      prvTidyUngetToken(doc);
      return;
    }
    BVar7 = prvTidynodeIsElement(node);
    if (BVar7 != no) {
      if (node->tag != (Dict *)0x0) {
        TVar1 = node->tag->id;
        if (TVar1 == TidyTag_BASE) {
          iVar4 = iVar11 + 1;
          iVar5 = iVar12;
          iVar8 = iVar11;
        }
        else {
          if (TVar1 != TidyTag_TITLE) goto LAB_00142070;
          iVar4 = iVar11;
          iVar5 = iVar12 + 1;
          iVar8 = iVar12;
        }
        iVar12 = iVar5;
        iVar11 = iVar4;
        if (0 < iVar8) {
          prvTidyReport(doc,head,node,0x27f);
        }
      }
LAB_00142070:
      node->parent = head;
      pNVar9 = head->last;
      node->prev = pNVar9;
      ppNVar10 = &pNVar9->next;
      if (pNVar9 == (Node *)0x0) {
        ppNVar10 = &head->content;
      }
      *ppNVar10 = node;
      head->last = node;
      ParseTag(doc,node,IgnoreWhitespace);
      goto LAB_00141f47;
    }
  }
LAB_00141f8b:
  prvTidyReport(doc,head,node,0x235);
  prvTidyFreeNode(doc,node);
  goto LAB_00141f47;
}

Assistant:

void TY_(ParseHead)(TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;

    DEBUG_LOG(SPRTF("Enter ParseHead...\n"));
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);
            ParseTag(doc, node, IgnoreWhitespace);
            continue;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseHead 1...\n"));
}